

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConjugateGradient.cpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::ConjugateGradient::getUpdatedDirection
          (ConjugateGradient *this,Problem *P,RealType gold2,
          DynamicVector<double,_std::allocator<double>_> *param_4)

{
  Problem *in_RDX;
  DynamicVector<double,_std::allocator<double>_> *in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  
  LineSearch::lastGradient
            ((LineSearch *)
             (in_RSI->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  OpenMD::operator-(in_RSI);
  Problem::gradientNormValue(in_RDX);
  LineSearch::searchDirection
            ((LineSearch *)
             (in_RSI->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  OpenMD::operator*((double)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  OpenMD::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2650bf);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2650c9);
  return in_RDI;
}

Assistant:

DynamicVector<RealType> ConjugateGradient::getUpdatedDirection(
      const Problem& P, RealType gold2, const DynamicVector<RealType>&) {
    return -lineSearch_->lastGradient() +
           (P.gradientNormValue() / gold2) * lineSearch_->searchDirection();
  }